

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
HecrSequential_cyclicRedictionFullMatrix_Test::TestBody
          (HecrSequential_cyclicRedictionFullMatrix_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  AssertHelper local_240;
  AssertionResult gtest_ar;
  vec solution;
  vec xs;
  vec rhs;
  vec cs;
  vec bs;
  vec as;
  TridiagonalMatrix m;
  double local_148 [8];
  double rhs_values [7];
  double local_c8 [8];
  double local_88 [8];
  double as_values [7];
  
  as_values[4] = 5.5;
  as_values[5] = -6.0;
  as_values[2] = 3.0;
  as_values[3] = 7.0;
  as_values[0] = 3.0;
  as_values[1] = 4.0;
  as_values[6] = 4.0;
  make_vector(&as,7,as_values);
  local_88[0] = 0.0;
  local_88[1] = -1.0;
  local_88[2] = 2.0;
  local_88[3] = 1.1;
  local_88[4] = 3.2;
  local_88[5] = 2.0;
  local_88[6] = 1.0;
  make_vector(&bs,7,local_88);
  local_c8[6] = 0.0;
  local_c8[0] = 2.0;
  local_c8[1] = 0.5;
  local_c8[2] = -0.7;
  local_c8[3] = 1.0;
  local_c8[4] = 0.8;
  local_c8[5] = 1.0;
  make_vector(&cs,7,local_c8);
  TridiagonalMatrix::TridiagonalMatrix(&m,&as,&bs,&cs);
  rhs_values[4] = (double)0x4021333333333333;
  rhs_values[5] = 26.0;
  rhs_values[2] = 1.0;
  rhs_values[3] = 0.9;
  rhs_values[0] = 7.0;
  rhs_values[1] = 6.5;
  rhs_values[6] = 13.0;
  make_vector(&rhs,7,rhs_values);
  local_148[3] = 0.0;
  local_148[0] = 1.0;
  local_148[1] = 2.0;
  local_148[2] = -1.0;
  local_148[4] = 2.0;
  local_148[5] = -3.0;
  local_148[6] = 4.0;
  make_vector(&xs,7,local_148);
  cyclic_reduction(&solution,&m,&rhs);
  local_248.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       max_diff(&xs,&solution);
  testing::internal::CmpHelperLT<double,double>
            ((internal *)&gtest_ar,"max_diff(xs, solution)","EPS",(double *)&local_248,&EPS);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_248);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x79,message);
    testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_248);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&solution.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rhs.super__Vector_base<double,_std::allocator<double>_>);
  TridiagonalMatrix::~TridiagonalMatrix(&m);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&as.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

TEST(HecrSequential, cyclicRedictionFullMatrix)
{
    int size = 7;
    const double as_values[] = { 3, 4, 3, 7, 5.5, -6, 4 };
    vec as = make_vector(size, as_values);
    const double bs_values[] = { 0, -1, 2, 1.1, 3.2, 2, 1 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] = { 2, 0.5, -0.7, 1, 0.8, 1, 0 };
    vec cs = make_vector(size, cs_values);
    TridiagonalMatrix m(as, bs, cs);
    const double rhs_values[] = { 7, 6.5, 1, 0.9, 8.6, 26, 13 };
    vec rhs = make_vector(size, rhs_values);
    const double xs_values[] = { 1, 2, -1, 0, 2, -3, 4 };
    vec xs = make_vector(size, xs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}